

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::Resign(CommissionerImpl *this,ErrorHandler *aHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Timer *pTVar3;
  Error local_38;
  
  pTVar3 = (Timer *)aHandler;
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((char)iVar2 != '\0') {
    SendKeepAlive(this,pTVar3,false);
  }
  if ((this->mKeepAliveTimer).mEnabled == true) {
    event_del(&(this->mKeepAliveTimer).mTimerEvent);
    (this->mKeepAliveTimer).mEnabled = false;
  }
  (*(this->super_Commissioner)._vptr_Commissioner[6])(this);
  paVar1 = &local_38.mMessage.field_2;
  local_38.mCode = kNone;
  local_38.mMessage._M_string_length = 0;
  local_38.mMessage.field_2._M_local_buf[0] = '\0';
  local_38.mMessage._M_dataplus._M_p = (pointer)paVar1;
  if ((aHandler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*aHandler->_M_invoker)((_Any_data *)aHandler,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.mMessage._M_dataplus._M_p != paVar1) {
      operator_delete(local_38.mMessage._M_dataplus._M_p);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void CommissionerImpl::Resign(ErrorHandler aHandler)
{
    if (IsActive())
    {
        SendKeepAlive(mKeepAliveTimer, false);
    }

    if (mKeepAliveTimer.IsRunning())
    {
        mKeepAliveTimer.Stop();
    }

    Disconnect();

    aHandler(ERROR_NONE);
}